

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsRFC7343(CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_b[0] = ' ';
    local_b[1] = '\x01';
    local_b[2] = 0;
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (2 < uVar3) {
      if (0x10 < uVar1) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar2 = 0;
      do {
        if (local_b[lVar2] != (this->m_addr)._union.direct[lVar2]) goto LAB_006bfec2;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      bVar4 = ((this->m_addr)._union.direct[3] & 0xf0U) == 0x20;
      goto LAB_006bfec4;
    }
  }
LAB_006bfec2:
  bVar4 = false;
LAB_006bfec4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC7343() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 3>{0x20, 0x01, 0x00}) &&
           (m_addr[3] & 0xF0) == 0x20;
}